

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatabaseUpgrader.cpp
# Opt level: O0

json read_json(path *root,string_view path)

{
  byte bVar1;
  runtime_error *this;
  json_value extraout_RDX;
  path *in_RSI;
  basic_string_view<char,_std::char_traits<char>_> *in_RDI;
  json jVar2;
  parse_error *e;
  ifstream db_file;
  json *db_json;
  nullptr_t in_stack_fffffffffffffd08;
  path *in_stack_fffffffffffffd10;
  undefined7 in_stack_fffffffffffffd18;
  undefined1 in_stack_fffffffffffffd1f;
  basic_string_view<char,_std::char_traits<char>_> *pbVar3;
  path *__lhs;
  path local_2a8 [2];
  undefined1 local_228 [80];
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *in_stack_fffffffffffffe28;
  istream *in_stack_fffffffffffffe30;
  
  __lhs = local_2a8;
  pbVar3 = in_RDI;
  std::experimental::filesystem::v1::__cxx11::path::
  path<std::basic_string_view<char,std::char_traits<char>>,std::experimental::filesystem::v1::__cxx11::path>
            (in_RSI,in_RDI);
  std::experimental::filesystem::v1::__cxx11::operator/(__lhs,in_RSI);
  std::ifstream::
  ifstream<std::experimental::filesystem::v1::__cxx11::path,std::experimental::filesystem::v1::__cxx11::path>
            ((basic_ifstream<char,_std::char_traits<char>_> *)in_RDI,
             (path *)CONCAT17(in_stack_fffffffffffffd1f,in_stack_fffffffffffffd18),
             (openmode)((ulong)in_stack_fffffffffffffd10 >> 0x20));
  std::experimental::filesystem::v1::__cxx11::path::~path(in_stack_fffffffffffffd10);
  std::experimental::filesystem::v1::__cxx11::path::~path(in_stack_fffffffffffffd10);
  bVar1 = std::ios::fail();
  if ((bVar1 & 1) != 0) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"Failed to open database file");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
  nlohmann::operator>>(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  std::ifstream::~ifstream(local_228);
  jVar2.m_value.object = extraout_RDX.object;
  jVar2._0_8_ = pbVar3;
  return jVar2;
}

Assistant:

json read_json(const fs::path &root, std::string_view path) {
    std::ifstream db_file(root / path, std::ifstream::binary);

    if (db_file.fail()) {
        throw std::runtime_error("Failed to open database file");
    }

    json db_json;

    try {
        db_file >> db_json;
    } catch (json::parse_error &e) {
        throw std::runtime_error("Failed to parse JSON");
    }
    return db_json;
}